

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t faster_despace32(char *bytes,size_t howmany)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = 0;
  for (sVar3 = 0; howmany != sVar3; sVar3 = sVar3 + 1) {
    bVar1 = bytes[sVar3];
    bytes[sVar2] = bVar1;
    sVar2 = (sVar2 + 1) - (ulong)(bVar1 < 0x21);
  }
  return sVar2;
}

Assistant:

size_t faster_despace32(char *bytes, size_t howmany) {
  size_t i = 0, pos = 0;
  while (i < howmany) {
    const char c = bytes[i++];
    bytes[pos] = c;
    pos += ((unsigned char)c > 32 ? 1 : 0);
  }
  return pos;
}